

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

void __thiscall
dynet::FastLSTMBuilder::new_graph_impl(FastLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  initializer_list<dynet::Expression> __l;
  Expression EVar1;
  Expression EVar2;
  Expression EVar3;
  Expression EVar4;
  Expression EVar5;
  Expression EVar6;
  Expression EVar7;
  Expression EVar8;
  Expression EVar9;
  Expression EVar10;
  Expression EVar11;
  reference pvVar12;
  byte in_DL;
  ParameterStorage *in_RSI;
  long in_RDI;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  Expression i_bc;
  Expression i_h2c;
  Expression i_x2c;
  Expression i_bo;
  Expression i_c2o;
  Expression i_h2o;
  Expression i_x2o;
  Expression i_bi;
  Expression i_c2i;
  Expression i_h2i;
  Expression i_x2i;
  value_type *p;
  uint i;
  ParameterStorage *in_stack_fffffffffffffcd8;
  Parameter in_stack_fffffffffffffce0;
  ParameterStorage *in_stack_fffffffffffffcf8;
  ParameterStorage *in_stack_fffffffffffffd00;
  ParameterStorage *in_stack_fffffffffffffd08;
  ParameterStorage *in_stack_fffffffffffffd10;
  ComputationGraph *local_258;
  undefined8 uStack_250;
  ComputationGraph *local_248;
  undefined8 uStack_240;
  ComputationGraph *local_238;
  undefined8 uStack_230;
  ComputationGraph *local_228;
  undefined8 uStack_220;
  ComputationGraph *local_218;
  undefined8 uStack_210;
  ComputationGraph *local_208;
  undefined8 uStack_200;
  ComputationGraph *local_1f8;
  undefined8 uStack_1f0;
  ComputationGraph *local_1e8;
  undefined8 uStack_1e0;
  ComputationGraph *local_1d8;
  undefined8 uStack_1d0;
  ComputationGraph *local_1c8;
  undefined8 uStack_1c0;
  ComputationGraph *local_1b8;
  undefined8 uStack_1b0;
  ComputationGraph **local_1a8;
  undefined8 local_1a0;
  ParameterStorage *local_180;
  ParameterStorage *local_178;
  Expression local_170;
  ParameterStorage *local_160;
  ParameterStorage *local_158;
  Expression local_150;
  ParameterStorage *local_140;
  ParameterStorage *local_138;
  Expression local_130;
  ParameterStorage *local_120;
  ParameterStorage *local_118;
  Expression local_110;
  ParameterStorage *local_100;
  ParameterStorage *local_f8;
  Expression local_f0;
  ParameterStorage *local_e0;
  ParameterStorage *local_d8;
  Expression local_d0;
  ParameterStorage *local_c0;
  ParameterStorage *local_b8;
  Expression local_b0;
  ParameterStorage *local_a0;
  ParameterStorage *local_98;
  Expression local_90;
  ParameterStorage *local_80;
  ParameterStorage *local_78;
  Expression local_70;
  ParameterStorage *local_60;
  ParameterStorage *local_58;
  Expression local_50;
  ParameterStorage *local_40;
  ParameterStorage *local_38;
  Expression local_30;
  reference local_20;
  uint local_18;
  byte local_11;
  ParameterStorage *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           *)0x9664ee);
  for (local_18 = 0; local_18 < *(uint *)(in_RDI + 0x168); local_18 = local_18 + 1) {
    local_20 = std::
               vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                             *)(in_RDI + 0xd0),(ulong)local_18);
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,0);
      local_40 = pvVar12->p;
      local_30 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,0);
      local_38 = pvVar12->p;
      local_30 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,1);
      local_60 = pvVar12->p;
      local_50 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,1);
      local_58 = pvVar12->p;
      local_50 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,2);
      local_80 = pvVar12->p;
      local_70 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,2);
      local_78 = pvVar12->p;
      local_70 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,3);
      local_a0 = pvVar12->p;
      local_90 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,3);
      local_98 = pvVar12->p;
      local_90 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,4);
      local_c0 = pvVar12->p;
      local_b0 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,4);
      local_b8 = pvVar12->p;
      local_b0 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,5);
      local_e0 = pvVar12->p;
      local_d0 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,5);
      local_d8 = pvVar12->p;
      local_d0 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,6);
      local_100 = pvVar12->p;
      local_f0 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,6);
      local_f8 = pvVar12->p;
      local_f0 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
    }
    if ((local_11 & 1) == 0) {
      in_stack_fffffffffffffd08 = local_10;
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,7);
      local_120 = pvVar12->p;
      local_110 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                  in_stack_fffffffffffffce0);
    }
    else {
      in_stack_fffffffffffffd10 = local_10;
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,7);
      local_118 = pvVar12->p;
      local_110 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0)
      ;
    }
    if ((local_11 & 1) == 0) {
      in_stack_fffffffffffffcf8 = local_10;
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,8);
      local_140 = pvVar12->p;
      local_130 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                  in_stack_fffffffffffffce0);
    }
    else {
      in_stack_fffffffffffffd00 = local_10;
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,8);
      local_138 = pvVar12->p;
      local_130 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0)
      ;
    }
    if ((local_11 & 1) == 0) {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,9);
      local_160 = pvVar12->p;
      local_150 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                  in_stack_fffffffffffffce0);
    }
    else {
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,9);
      local_158 = pvVar12->p;
      local_150 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0)
      ;
    }
    if ((local_11 & 1) == 0) {
      in_stack_fffffffffffffcd8 = local_10;
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,10);
      local_180 = pvVar12->p;
      local_170 = const_parameter((ComputationGraph *)in_stack_fffffffffffffcd8,
                                  in_stack_fffffffffffffce0);
    }
    else {
      in_stack_fffffffffffffce0.p = local_10;
      pvVar12 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                          (local_20,10);
      local_178 = pvVar12->p;
      local_170 = parameter((ComputationGraph *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0)
      ;
    }
    EVar11 = local_30;
    EVar10 = local_50;
    EVar9 = local_70;
    EVar8 = local_90;
    EVar7 = local_b0;
    EVar6 = local_d0;
    EVar5 = local_f0;
    EVar4 = local_110;
    EVar3 = local_130;
    EVar2 = local_150;
    EVar1 = local_170;
    local_258 = local_30.pg;
    uStack_250._0_4_ = local_30.i;
    uStack_250._4_4_ = local_30.graph_id;
    local_248 = local_50.pg;
    uStack_240._0_4_ = local_50.i;
    uStack_240._4_4_ = local_50.graph_id;
    local_238 = local_70.pg;
    uStack_230._0_4_ = local_70.i;
    uStack_230._4_4_ = local_70.graph_id;
    local_228 = local_90.pg;
    uStack_220._0_4_ = local_90.i;
    uStack_220._4_4_ = local_90.graph_id;
    local_218 = local_b0.pg;
    uStack_210._0_4_ = local_b0.i;
    uStack_210._4_4_ = local_b0.graph_id;
    local_208 = local_d0.pg;
    uStack_200._0_4_ = local_d0.i;
    uStack_200._4_4_ = local_d0.graph_id;
    local_1f8 = local_f0.pg;
    uStack_1f0._0_4_ = local_f0.i;
    uStack_1f0._4_4_ = local_f0.graph_id;
    local_1e8 = local_110.pg;
    uStack_1e0._0_4_ = local_110.i;
    uStack_1e0._4_4_ = local_110.graph_id;
    local_1d8 = local_130.pg;
    uStack_1d0._0_4_ = local_130.i;
    uStack_1d0._4_4_ = local_130.graph_id;
    local_1c8 = local_150.pg;
    uStack_1c0._0_4_ = local_150.i;
    uStack_1c0._4_4_ = local_150.graph_id;
    local_1b8 = local_170.pg;
    uStack_1b0._0_4_ = local_170.i;
    uStack_1b0._4_4_ = local_170.graph_id;
    local_1a8 = &local_258;
    local_1a0 = 0xb;
    local_170 = EVar1;
    local_150 = EVar2;
    local_130 = EVar3;
    local_110 = EVar4;
    local_f0 = EVar5;
    local_d0 = EVar6;
    local_b0 = EVar7;
    local_90 = EVar8;
    local_70 = EVar9;
    local_50 = EVar10;
    local_30 = EVar11;
    std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0x966d51);
    __l._M_len = (size_type)in_stack_fffffffffffffd10;
    __l._M_array = (iterator)in_stack_fffffffffffffd08;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               in_stack_fffffffffffffd00,__l,(allocator_type *)in_stack_fffffffffffffcf8);
    std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0x966d82);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 *)in_stack_fffffffffffffce0.p,(value_type *)in_stack_fffffffffffffcd8);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               in_stack_fffffffffffffce0.p);
  }
  return;
}

Assistant:

void FastLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update){
  param_vars.clear();

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];

    //i
    Expression i_x2i = update ? parameter(cg,p[X2I]) : const_parameter(cg,p[X2I]);
    Expression i_h2i = update ? parameter(cg,p[H2I]) : const_parameter(cg,p[H2I]);
    Expression i_c2i = update ? parameter(cg,p[C2I]) : const_parameter(cg,p[C2I]);
    Expression i_bi = update ? parameter(cg,p[BI]) : const_parameter(cg,p[BI]);
    //o
    Expression i_x2o = update ? parameter(cg,p[X2O]) : const_parameter(cg,p[X2O]);
    Expression i_h2o = update ? parameter(cg,p[H2O]) : const_parameter(cg,p[H2O]);
    Expression i_c2o = update ? parameter(cg,p[C2O]) : const_parameter(cg,p[C2O]);
    Expression i_bo = update ? parameter(cg,p[BO]) : const_parameter(cg,p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg,p[X2C]) : const_parameter(cg,p[X2C]);
    Expression i_h2c = update ? parameter(cg,p[H2C]) : const_parameter(cg,p[H2C]);
    Expression i_bc = update ? parameter(cg,p[BC]) : const_parameter(cg,p[BC]);

    vector<Expression> vars = {i_x2i, i_h2i, i_c2i, i_bi, i_x2o, i_h2o, i_c2o, i_bo, i_x2c, i_h2c, i_bc};
    param_vars.push_back(vars);
  }
}